

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O0

SparseMatrix<double,_0,_int> * __thiscall
Eigen::SparseMatrix<double,0,int>::operator=
          (SparseMatrix<double,0,int> *this,
          SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_> *other)

{
  Scalar SVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  bool bVar7;
  Index rows;
  Index cols;
  Index IVar8;
  Index IVar9;
  char *pcVar10;
  Scalar *pSVar11;
  char *pcVar12;
  Scalar *pSVar13;
  Scalar_conflict *pSVar14;
  int __c;
  int __c_00;
  undefined1 local_100 [4];
  Index pos;
  InnerIterator it_1;
  Index j_2;
  Index tmp;
  Index j_1;
  Matrix<int,__1,_1,_0,__1,_1> positions;
  undefined1 local_b8 [4];
  Index count;
  InnerIterator it;
  Stride<0,_0> local_8e;
  Index j;
  Map<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_80;
  undefined1 local_68 [8];
  SparseMatrix<double,_0,_int> dest;
  OtherCopy otherCopy;
  bool needToTranspose;
  SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_> *other_local;
  SparseMatrix<double,_0,_int> *this_local;
  
  dest.m_data.m_allocatedSize =
       (size_t)SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>::derived(other);
  rows = SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>::rows(other);
  cols = SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>::cols(other);
  SparseMatrix<double,_0,_int>::SparseMatrix((SparseMatrix<double,_0,_int> *)local_68,rows,cols);
  uVar6 = dest._8_8_;
  IVar8 = SparseMatrix<double,_0,_int>::outerSize((SparseMatrix<double,_0,_int> *)local_68);
  Stride<0,_0>::Stride(&local_8e);
  Map<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (&local_80,(PointerArgType)uVar6,(long)IVar8,&local_8e);
  DenseBase<Eigen::Map<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::setZero
            ((DenseBase<Eigen::Map<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_> *
             )&local_80);
  it._28_4_ = 0;
  while( true ) {
    uVar4 = it._28_4_;
    IVar9 = SparseMatrix<double,_1,_int>::outerSize
                      ((SparseMatrix<double,_1,_int> *)dest.m_data.m_allocatedSize);
    if (IVar9 <= (int)uVar4) break;
    pcVar12 = (char *)dest.m_data.m_allocatedSize;
    SparseMatrix<double,_1,_int>::InnerIterator::InnerIterator
              ((InnerIterator *)local_b8,(SparseMatrix<double,_1,_int> *)dest.m_data.m_allocatedSize
               ,it._28_4_);
    while( true ) {
      bVar7 = SparseMatrix::InnerIterator::operator_cast_to_bool((InnerIterator *)local_b8);
      uVar6 = dest._8_8_;
      if (!bVar7) break;
      pcVar10 = SparseMatrix<double,_1,_int>::InnerIterator::index
                          ((InnerIterator *)local_b8,pcVar12,__c);
      *(int *)(uVar6 + (long)(int)pcVar10 * 4) = *(int *)(uVar6 + (long)(int)pcVar10 * 4) + 1;
      SparseMatrix<double,_1,_int>::InnerIterator::operator++((InnerIterator *)local_b8);
    }
    it._28_4_ = it._28_4_ + 1;
  }
  positions.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 0;
  IVar8 = SparseMatrix<double,_0,_int>::outerSize((SparseMatrix<double,_0,_int> *)local_68);
  Matrix<int,_-1,_1,_0,_-1,_1>::Matrix((Matrix<int,__1,_1,_0,__1,_1> *)&tmp,(long)IVar8);
  j_2 = 0;
  while( true ) {
    IVar8 = SparseMatrix<double,_0,_int>::outerSize((SparseMatrix<double,_0,_int> *)local_68);
    iVar3 = positions.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
            _4_4_;
    if (IVar8 <= j_2) break;
    iVar2 = *(int *)(dest._8_8_ + (long)j_2 * 4);
    *(int *)(dest._8_8_ + (long)j_2 * 4) =
         positions.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
         _4_4_;
    pSVar11 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&tmp,(long)j_2);
    *pSVar11 = iVar3;
    positions.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
         iVar2 + positions.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows._4_4_;
    j_2 = j_2 + 1;
  }
  IVar8 = SparseMatrix<double,_0,_int>::outerSize((SparseMatrix<double,_0,_int> *)local_68);
  *(int *)(dest._8_8_ + (long)IVar8 * 4) = iVar3;
  internal::CompressedStorage<double,_int>::resize
            ((CompressedStorage<double,_int> *)&dest.m_innerNonZeros,
             (long)positions.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows._4_4_,0.0);
  it_1._28_4_ = 0;
  while( true ) {
    uVar4 = it_1._28_4_;
    IVar9 = SparseMatrix<double,_1,_int>::outerSize
                      ((SparseMatrix<double,_1,_int> *)dest.m_data.m_allocatedSize);
    if (IVar9 <= (int)uVar4) break;
    pcVar12 = (char *)dest.m_data.m_allocatedSize;
    SparseMatrix<double,_1,_int>::InnerIterator::InnerIterator
              ((InnerIterator *)local_100,
               (SparseMatrix<double,_1,_int> *)dest.m_data.m_allocatedSize,it_1._28_4_);
    while( true ) {
      bVar7 = SparseMatrix::InnerIterator::operator_cast_to_bool((InnerIterator *)local_100);
      if (!bVar7) break;
      pcVar12 = SparseMatrix<double,_1,_int>::InnerIterator::index
                          ((InnerIterator *)local_100,pcVar12,__c_00);
      pSVar11 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&tmp,
                           (long)(int)pcVar12);
      uVar4 = it_1._28_4_;
      iVar3 = *pSVar11;
      *pSVar11 = iVar3 + 1;
      pcVar12 = internal::CompressedStorage<double,_int>::index
                          ((CompressedStorage<double,_int> *)&dest.m_innerNonZeros,
                           (char *)(long)iVar3,iVar3 + 1);
      uVar5 = it_1._28_4_;
      it_1._28_1_ = SUB41(uVar4,0);
      it_1._29_1_ = SUB41(uVar4,1);
      it_1._30_1_ = SUB41(uVar4,2);
      it_1._31_1_ = SUB41(uVar4,3);
      pcVar12[0] = it_1._28_1_;
      pcVar12[1] = it_1._29_1_;
      pcVar12[2] = it_1._30_1_;
      pcVar12[3] = it_1._31_1_;
      it_1._28_4_ = uVar5;
      pSVar13 = SparseMatrix<double,_1,_int>::InnerIterator::value((InnerIterator *)local_100);
      SVar1 = *pSVar13;
      pcVar12 = (char *)(long)iVar3;
      pSVar14 = internal::CompressedStorage<double,_int>::value
                          ((CompressedStorage<double,_int> *)&dest.m_innerNonZeros,(size_t)pcVar12);
      *pSVar14 = SVar1;
      SparseMatrix<double,_1,_int>::InnerIterator::operator++((InnerIterator *)local_100);
    }
    it_1._28_4_ = it_1._28_4_ + 1;
  }
  SparseMatrix<double,_0,_int>::swap
            ((SparseMatrix<double,_0,_int> *)this,(SparseMatrix<double,_0,_int> *)local_68);
  Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)&tmp);
  SparseMatrix<double,_0,_int>::~SparseMatrix((SparseMatrix<double,_0,_int> *)local_68);
  return (SparseMatrix<double,_0,_int> *)this;
}

Assistant:

EIGEN_DONT_INLINE SparseMatrix<Scalar,_Options,_Index>& SparseMatrix<Scalar,_Options,_Index>::operator=(const SparseMatrixBase<OtherDerived>& other)
{
  EIGEN_STATIC_ASSERT((internal::is_same<Scalar, typename OtherDerived::Scalar>::value),
        YOU_MIXED_DIFFERENT_NUMERIC_TYPES__YOU_NEED_TO_USE_THE_CAST_METHOD_OF_MATRIXBASE_TO_CAST_NUMERIC_TYPES_EXPLICITLY)
  
  const bool needToTranspose = (Flags & RowMajorBit) != (OtherDerived::Flags & RowMajorBit);
  if (needToTranspose)
  {
    // two passes algorithm:
    //  1 - compute the number of coeffs per dest inner vector
    //  2 - do the actual copy/eval
    // Since each coeff of the rhs has to be evaluated twice, let's evaluate it if needed
    typedef typename internal::nested<OtherDerived,2>::type OtherCopy;
    typedef typename internal::remove_all<OtherCopy>::type _OtherCopy;
    OtherCopy otherCopy(other.derived());

    SparseMatrix dest(other.rows(),other.cols());
    Eigen::Map<Matrix<Index, Dynamic, 1> > (dest.m_outerIndex,dest.outerSize()).setZero();

    // pass 1
    // FIXME the above copy could be merged with that pass
    for (Index j=0; j<otherCopy.outerSize(); ++j)
      for (typename _OtherCopy::InnerIterator it(otherCopy, j); it; ++it)
        ++dest.m_outerIndex[it.index()];

    // prefix sum
    Index count = 0;
    Matrix<Index,Dynamic,1> positions(dest.outerSize());
    for (Index j=0; j<dest.outerSize(); ++j)
    {
      Index tmp = dest.m_outerIndex[j];
      dest.m_outerIndex[j] = count;
      positions[j] = count;
      count += tmp;
    }
    dest.m_outerIndex[dest.outerSize()] = count;
    // alloc
    dest.m_data.resize(count);
    // pass 2
    for (Index j=0; j<otherCopy.outerSize(); ++j)
    {
      for (typename _OtherCopy::InnerIterator it(otherCopy, j); it; ++it)
      {
        Index pos = positions[it.index()]++;
        dest.m_data.index(pos) = j;
        dest.m_data.value(pos) = it.value();
      }
    }
    this->swap(dest);
    return *this;
  }
  else
  {
    if(other.isRValue())
      initAssignment(other.derived());
    // there is no special optimization
    return Base::operator=(other.derived());
  }
}